

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O3

void translate(quadtype nextquad)

{
  quadtype nextquad_00;
  quadtype nextquad_01;
  quadtype nextquad_02;
  quadtype nextquad_03;
  quadtype nextquad_04;
  quadtype nextquad_05;
  quadtype nextquad_06;
  quadtype nextquad_07;
  quadtype nextquad_08;
  quadtype nextquad_09;
  quadtype nextquad_10;
  undefined4 in_stack_00000008;
  int in_stack_00000010;
  undefined1 in_stack_00000014 [12];
  undefined4 in_stack_0000003c;
  undefined1 in_stack_00000040 [12];
  undefined1 in_stack_0000004c [16];
  char local_12 [10];
  
  switch(in_stack_00000008) {
  case 1:
    nextquad_09._12_16_ = in_stack_0000004c;
    nextquad_09._0_12_ = in_stack_00000040;
    transadd(nextquad_09);
    return;
  case 2:
    nextquad_06._12_16_ = in_stack_0000004c;
    nextquad_06._0_12_ = in_stack_00000040;
    transsub(nextquad_06);
    return;
  case 3:
    nextquad_10._12_16_ = in_stack_0000004c;
    nextquad_10._0_12_ = in_stack_00000040;
    transneg(nextquad_10);
    return;
  case 4:
    nextquad_08._12_16_ = in_stack_0000004c;
    nextquad_08._0_12_ = in_stack_00000040;
    transmult(nextquad_08);
    return;
  case 5:
    nextquad_05._12_16_ = in_stack_0000004c;
    nextquad_05._0_12_ = in_stack_00000040;
    transdiv(nextquad_05);
    return;
  case 6:
    nextquad_07._12_16_ = in_stack_0000004c;
    nextquad_07._0_12_ = in_stack_00000040;
    transassn(nextquad_07);
    return;
  case 7:
    nextquad_04.op2.opndtype = in_stack_0000003c;
    nextquad_04.opcode = nextquad.op2.opnd;
    nextquad_04.op1 = nextquad.op3;
    nextquad_04._16_12_ = in_stack_00000040;
    transarg(nextquad_04);
    return;
  case 8:
    transjump(nextquad);
    return;
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    nextquad_02.op2.opndtype = in_stack_0000003c;
    nextquad_02.opcode = nextquad.op2.opnd;
    nextquad_02.op1 = nextquad.op3;
    nextquad_02._16_12_ = in_stack_00000040;
    transifjump(nextquad_02);
    return;
  case 0xf:
    getlabel(in_stack_00000010,local_12);
    fprintf((FILE *)ofp,"%s:\n\n",local_12);
    break;
  case 0x11:
    nextquad_03.op2.opndtype = in_stack_0000003c;
    nextquad_03.opcode = nextquad.op2.opnd;
    nextquad_03.op1 = nextquad.op3;
    nextquad_03._16_12_ = in_stack_00000040;
    transproc(nextquad_03);
    return;
  case 0x12:
    nextquad_01._4_12_ = in_stack_00000014;
    nextquad_01.opcode = in_stack_00000010;
    nextquad_01.op2.opnd = nextquad.opcode;
    nextquad_01.op3 = nextquad.op1;
    transread(nextquad_01);
    return;
  case 0x13:
    nextquad_00._4_12_ = in_stack_00000014;
    nextquad_00.opcode = in_stack_00000010;
    nextquad_00.op2.opnd = nextquad.opcode;
    nextquad_00.op3 = nextquad.op1;
    transwrite(nextquad_00);
    return;
  }
  return;
}

Assistant:

void    translate(struct quadtype nextquad)
{
    switch(nextquad.opcode)    {
        case opadd:        transadd(nextquad);  break;
        case opsub:        transsub(nextquad);  break;
        case opneg:        transneg(nextquad);  break;
        case opmult:        transmult(nextquad); break;
        case opdiv:        transdiv(nextquad); break;
        case opassn:      transassn(nextquad);  break;
        case opjump:        transjump(nextquad); break;
        case opifposzjump:
        case opifposjump:
        case opifnegzjump:
        case opifnegjump:
        case opifzjump:
        case opifnzjump:    transifjump(nextquad); break;
            
        case oplabel:        translabel(nextquad); break;
        case opread:        transread(nextquad); break;
        case opwrite:        transwrite(nextquad); break;
        case oparg:        transarg(nextquad); break;
        case opproc:        transproc(nextquad); break;
        default: break;
    }
}